

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

object __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::Point<3L>_>::get
          (PythonDataType<anurbs::Model,_anurbs::Point<3L>_> *this,Model *model,string *key)

{
  string *in_RCX;
  handle local_70 [3];
  string local_58 [32];
  string *key_local;
  Model *model_local;
  PythonDataType<anurbs::Model,_anurbs::Point<3L>_> *this_local;
  
  key_local = key;
  model_local = model;
  this_local = this;
  std::__cxx11::string::string(local_58,in_RCX);
  Model::get<anurbs::Point<3l>>((Model *)&stack0xffffffffffffffc8,key);
  local_70[0].m_ptr = (PyObject *)0x0;
  pybind11::handle::handle(local_70);
  pybind11::cast<anurbs::Ref<anurbs::Point<3L>_>,_0>
            ((pybind11 *)this,(Ref<anurbs::Point<3L>_> *)&stack0xffffffffffffffc8,
             automatic_reference,local_70[0]);
  Ref<anurbs::Point<3L>_>::~Ref((Ref<anurbs::Point<3L>_> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  return (object)(handle)this;
}

Assistant:

pybind11::object get(const TModel& model, const std::string& key)
        override
    {
        return pybind11::cast(model.template get<TData>(key));
    }